

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.c
# Opt level: O0

UINT32 ByteArrayToUint32(BYTE *a)

{
  UINT32 retVal;
  BYTE *a_local;
  
  return (uint)a[3] + ((uint)a[2] + ((uint)a[1] + (uint)*a * 0x100) * 0x100) * 0x100;
}

Assistant:

UINT32 ByteArrayToUint32(BYTE* a)
{
    UINT32      retVal;
    retVal  = a[0]; retVal <<= 8;
    retVal += a[1]; retVal <<= 8;
    retVal += a[2]; retVal <<= 8;
    retVal += a[3];
    return retVal;
}